

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# project.cpp
# Opt level: O1

string * getHomePath_abi_cxx11_(void)

{
  long lVar1;
  char *__s;
  char *pcVar2;
  char *pcVar3;
  size_t sVar4;
  long *plVar5;
  long *plVar6;
  size_type *psVar7;
  string *in_RDI;
  allocator local_69;
  long *local_68;
  long local_60;
  long local_58;
  long lStack_50;
  undefined1 *local_48 [2];
  undefined1 local_38 [16];
  
  __s = getenv("QGREP_HOME");
  if (__s == (char *)0x0) {
    __s = getenv("HOME");
  }
  pcVar2 = getenv("HOMEDRIVE");
  pcVar3 = getenv("HOMEPATH");
  if (((__s == (char *)0x0) && (pcVar2 == (char *)0x0)) && (pcVar3 == (char *)0x0)) {
    (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
    std::__cxx11::string::_M_construct<char_const*>();
  }
  else {
    if (__s == (char *)0x0) {
      std::__cxx11::string::string((string *)local_48,pcVar2,&local_69);
      plVar5 = (long *)std::__cxx11::string::append((char *)local_48);
      local_68 = &local_58;
      plVar6 = plVar5 + 2;
      if ((long *)*plVar5 == plVar6) {
        local_58 = *plVar6;
        lStack_50 = plVar5[3];
      }
      else {
        local_58 = *plVar6;
        local_68 = (long *)*plVar5;
      }
      local_60 = plVar5[1];
      *plVar5 = (long)plVar6;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
    }
    else {
      local_68 = &local_58;
      sVar4 = strlen(__s);
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,__s,__s + sVar4);
    }
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_68);
    (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
    psVar7 = (size_type *)(plVar5 + 2);
    if ((size_type *)*plVar5 == psVar7) {
      lVar1 = plVar5[3];
      (in_RDI->field_2)._M_allocated_capacity = *psVar7;
      *(long *)((long)&in_RDI->field_2 + 8) = lVar1;
    }
    else {
      (in_RDI->_M_dataplus)._M_p = (pointer)*plVar5;
      (in_RDI->field_2)._M_allocated_capacity = *psVar7;
    }
    in_RDI->_M_string_length = plVar5[1];
    *plVar5 = (long)psVar7;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    if (local_68 != &local_58) {
      operator_delete(local_68);
    }
    if ((__s == (char *)0x0) && (local_48[0] != local_38)) {
      operator_delete(local_48[0]);
    }
  }
  return in_RDI;
}

Assistant:

static std::string getHomePath()
{
    char* qghome = getenv("QGREP_HOME");
    char* home = qghome ? qghome : getenv("HOME");
	const char* drive = getenv("HOMEDRIVE");
	const char* path = getenv("HOMEPATH");

    if (!home && !drive && !path) return "";

	return (home ? std::string(home) : std::string(drive) + path) + "/.qgrep";
}